

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

void __thiscall llvm::APInt::setBit(APInt *this,uint BitPosition)

{
  uint64_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint64_t uVar4;
  WordType Mask;
  uint BitPosition_local;
  APInt *this_local;
  
  if (this->BitWidth < BitPosition) {
    __assert_fail("BitPosition <= BitWidth && \"BitPosition out of range\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x575,"void llvm::APInt::setBit(unsigned int)");
  }
  uVar4 = maskBit(BitPosition);
  bVar2 = isSingleWord(this);
  if (bVar2) {
    (this->U).VAL = uVar4 | (this->U).VAL;
  }
  else {
    puVar1 = (this->U).pVal;
    uVar3 = whichWord(BitPosition);
    puVar1[uVar3] = uVar4 | puVar1[uVar3];
  }
  return;
}

Assistant:

void setBit(unsigned BitPosition) {
    assert(BitPosition <= BitWidth && "BitPosition out of range");
    WordType Mask = maskBit(BitPosition);
    if (isSingleWord())
      U.VAL |= Mask;
    else
      U.pVal[whichWord(BitPosition)] |= Mask;
  }